

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgregoriancalendar.cpp
# Opt level: O3

YearMonthDay QGregorianCalendar::partsFromJulian(qint64 jd)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  YearMonthDay YVar7;
  
  if (jd < 0x1a4320) {
    uVar5 = ~((ulong)-(jd * 4 + -0x690c7c) / 0x23ab1);
  }
  else {
    uVar5 = (jd * 4 - 0x690c7dU) / 0x23ab1;
  }
  iVar4 = ((int)jd + -0x1a431f) - (int)(uVar5 * 0x23ab1 >> 2);
  if (iVar4 < 1) {
    uVar2 = ~((uint)(iVar4 * -4) / 0x5b5);
  }
  else {
    uVar2 = (iVar4 * 4 - 1U) / 0x5b5;
  }
  iVar4 = iVar4 - (uVar2 * 0x5b5 >> 2);
  if (iVar4 < 1) {
    uVar6 = ~((iVar4 * -5 + 2U) / 0x99);
  }
  else {
    uVar6 = (iVar4 * 5 - 3U) / 0x99;
  }
  uVar1 = uVar6 - 0xc;
  if ((int)uVar6 < 10) {
    uVar1 = uVar6;
  }
  iVar3 = (uint)(9 < (int)uVar6) + (int)uVar5 * 100 + uVar2;
  YVar7.year = iVar3 - (uint)(iVar3 < 1);
  YVar7.month = uVar1 + 3;
  YVar7.day = iVar4 - (uVar6 * 0x99 + 2) / 5;
  return YVar7;
}

Assistant:

QCalendar::YearMonthDay QGregorianCalendar::partsFromJulian(qint64 jd)
{
    const qint64 dayNumber = jd - BaseJd;
    const qint64 century = qDiv<FourCenturies>(4 * dayNumber - 1);
    const int dayInCentury = dayNumber - qDiv<4>(FourCenturies * century);

    const int yearInCentury = qDiv<FourYears>(4 * dayInCentury - 1);
    const int dayInYear = dayInCentury - qDiv<4>(FourYears * yearInCentury);
    const int m = qDiv<FiveMonths>(5 * dayInYear - 3);
    Q_ASSERT(m < 12 && m >= 0);
    // That m is a month adjusted to March = 0, with Jan = 10, Feb = 11 in the previous year.
    const int yearOffset = m < 10 ? 0 : 1;

    const int y = 100 * century + yearInCentury + yearOffset;
    const int month = m + 3 - 12 * yearOffset;
    const int day = dayInYear - qDiv<5>(FiveMonths * m + 2);

    // Adjust for no year 0
    return QCalendar::YearMonthDay(y > 0 ? y : y - 1, month, day);
}